

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float SliderBehaviorCalcRatioFromValue<double,double>
                (ImGuiDataType data_type,double v,double v_min,double v_max,float power,
                float linear_zero_pos)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double local_58;
  bool local_4a;
  float f_1;
  float f;
  double v_clamped;
  bool is_power;
  float linear_zero_pos_local;
  float power_local;
  double v_max_local;
  double v_min_local;
  double v_local;
  ImGuiDataType data_type_local;
  
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    local_4a = false;
    if ((power != 1.0) || (NAN(power))) {
      local_4a = data_type == 4 || data_type == 5;
    }
    if (v_max <= v_min) {
      local_58 = ImClamp<double>(v,v_max,v_min);
    }
    else {
      local_58 = ImClamp<double>(v,v_min,v_max);
    }
    if (local_4a) {
      if (0.0 <= local_58) {
        dVar2 = ImMax<double>(0.0,v_min);
        dVar3 = ImMax<double>(0.0,v_min);
        fVar1 = ImPow((float)((local_58 - dVar2) / (v_max - dVar3)),1.0 / power);
        v_local._4_4_ = fVar1 * (1.0 - linear_zero_pos) + linear_zero_pos;
      }
      else {
        dVar2 = ImMin<double>(0.0,v_max);
        fVar1 = ImPow(1.0 - (float)((local_58 - v_min) / (dVar2 - v_min)),1.0 / power);
        v_local._4_4_ = (1.0 - fVar1) * linear_zero_pos;
      }
    }
    else {
      v_local._4_4_ = (float)((local_58 - v_min) / (v_max - v_min));
    }
  }
  else {
    v_local._4_4_ = 0.0;
  }
  return v_local._4_4_;
}

Assistant:

static inline float SliderBehaviorCalcRatioFromValue(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}